

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O1

void __thiscall dlib::rand::set_seed(rand *this,string *value)

{
  int *piVar1;
  int iVar2;
  size_type sVar3;
  uint uVar4;
  int iVar5;
  int block;
  size_type sVar6;
  
  std::__cxx11::string::_M_assign((string *)&this->seed);
  if (value->_M_string_length == 0) {
    (this->mt).x[0] = 0x1571;
    (this->mt).i = 1;
    iVar5 = 1;
    do {
      uVar4 = (this->mt).x[(long)iVar5 + -1];
      (this->mt).x[iVar5] = (uVar4 >> 0x1e ^ uVar4) * 0x6c078965 + iVar5;
      iVar2 = (this->mt).i;
      iVar5 = iVar2 + 1;
      (this->mt).i = iVar5;
    } while (iVar2 < 0x26f);
  }
  else {
    sVar3 = (this->seed)._M_string_length;
    if (sVar3 == 0) {
      uVar4 = 0;
    }
    else {
      sVar6 = 0;
      uVar4 = 0;
      do {
        uVar4 = (int)(this->seed)._M_dataplus._M_p[sVar6] + uVar4 * 0x25;
        sVar6 = sVar6 + 1;
      } while (sVar3 != sVar6);
    }
    (this->mt).x[0] = uVar4;
    (this->mt).i = 1;
    iVar5 = 1;
    do {
      uVar4 = (this->mt).x[(long)iVar5 + -1];
      (this->mt).x[iVar5] = (uVar4 >> 0x1e ^ uVar4) * 0x6c078965 + iVar5;
      iVar2 = (this->mt).i;
      iVar5 = iVar2 + 1;
      (this->mt).i = iVar5;
    } while (iVar2 < 0x26f);
  }
  iVar5 = 10000;
  do {
    iVar2 = (this->mt).i;
    block = 0;
    if ((iVar2 == 0x270) || (block = 1, 0x4df < iVar2)) {
      random_helpers::
      mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
      ::twist(&this->mt,block);
    }
    piVar1 = &(this->mt).i;
    *piVar1 = *piVar1 + 1;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  this->has_gaussian = false;
  this->next_gaussian = 0.0;
  return;
}

Assistant:

void set_seed (
                const std::string& value
            )
            {
                seed = value;

                // make sure we do the seeding so that using a seed of "" gives the same
                // state as calling this->clear()
                if (value.size() != 0)
                {
                    uint32 s = 0;
                    for (std::string::size_type i = 0; i < seed.size(); ++i)
                    {
                        s = (s*37) + static_cast<uint32>(seed[i]);
                    }
                    mt.seed(s);
                }
                else
                {
                    mt.seed();
                }

                // prime the generator a bit
                for (int i = 0; i < 10000; ++i)
                    mt();


                has_gaussian = false;
                next_gaussian = 0;
            }